

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_floor>(Mat *a,Option *opt)

{
  long *in_RDI;
  float fVar1;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_floor op;
  Mat *m;
  __m128 fixed_result;
  __m128 negative_fix;
  __m128 truncated_with_sign;
  __m128 truncated;
  __m128 no_fraction;
  __m128 negative_mask;
  __m128 absolute;
  __m128 magic_smallest_no_fraction;
  __m128 magic_negative_zero;
  ulong local_3e8;
  ulong uStack_3e0;
  int local_3d4;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  long local_3b0;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined8 local_390;
  float *local_388;
  int local_380;
  int local_37c;
  int local_378;
  int local_374;
  int local_370;
  int local_36c;
  int local_368;
  undefined1 local_361 [9];
  long *local_358;
  undefined1 local_34d;
  int local_34c;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_328;
  float *local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  float *local_308;
  long local_300;
  undefined4 local_2f4;
  long local_2f0;
  float *local_2e8;
  undefined4 local_2dc;
  int local_2d8;
  int local_2d4;
  undefined8 *local_2d0;
  undefined4 local_2c4;
  long local_2c0;
  undefined8 *local_2b0;
  ulong *local_288;
  undefined1 *local_280;
  float *local_278;
  undefined1 *local_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  ulong local_188;
  ulong uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong local_158;
  ulong uStack_150;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ulong local_118;
  ulong uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  ulong local_a8;
  ulong uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 local_4;
  
  local_368 = *(int *)((long)in_RDI + 0x2c);
  local_36c = (int)in_RDI[6];
  local_370 = *(int *)((long)in_RDI + 0x34);
  local_374 = (int)in_RDI[7];
  local_378 = (int)in_RDI[3];
  local_37c = local_368 * local_36c * local_370 * local_378;
  local_358 = in_RDI;
  for (local_380 = 0; local_380 < local_374; local_380 = local_380 + 1) {
    local_340 = &local_3d0;
    local_2d4 = *(int *)((long)local_358 + 0x2c);
    local_2d8 = (int)local_358[6];
    local_2dc = *(undefined4 *)((long)local_358 + 0x34);
    local_2e8 = (float *)(*local_358 + local_358[8] * (long)local_380 * local_358[2]);
    local_2f0 = local_358[2];
    local_2f4 = (undefined4)local_358[3];
    local_300 = local_358[4];
    local_2d0 = &local_3d0;
    local_2c0 = (long)local_2d4 * (long)local_2d8 * local_2f0;
    local_338 = &local_3d0;
    local_328 = &local_3d0;
    local_2c4 = 0x10;
    local_34c = local_380;
    local_34d = 1;
    local_3d0 = 0;
    local_3c0 = 0;
    local_3b8 = 0;
    local_3a8 = 0;
    local_3a4 = 0;
    local_3a0 = 0;
    local_39c = 0;
    local_398 = 0;
    local_390 = 0;
    local_3c8 = 0;
    local_388 = local_2e8;
    for (local_3d4 = 0; local_2b0 = local_328, local_3b0 = local_300, local_3d4 + 3 < local_37c;
        local_3d4 = local_3d4 + 4) {
      local_320 = local_388;
      local_1d8 = *(ulong *)local_388;
      uStack_1d0 = *(ulong *)(local_388 + 2);
      local_280 = local_361;
      local_288 = &local_3e8;
      local_13c = 0x80000000;
      local_3c = 0x80000000;
      local_58 = 0x80000000;
      local_1e8 = 0x8000000080000000;
      uStack_1e0 = 0x8000000080000000;
      local_140 = 0x4b000000;
      local_1c = 0x4b000000;
      local_38 = 0x4b000000;
      local_1f8 = 0x4b0000004b000000;
      uStack_1f0 = 0x4b0000004b000000;
      local_208 = local_1d8 & 0x7fffffff7fffffff;
      uStack_200 = uStack_1d0 & 0x7fffffff7fffffff;
      local_218 = local_1d8 & 0x8000000080000000;
      uStack_210 = uStack_1d0 & 0x8000000080000000;
      local_d8._0_4_ = (float)local_208;
      local_d8._4_4_ = (float)(local_208 >> 0x20);
      uStack_d0._0_4_ = (float)uStack_200;
      uStack_d0._4_4_ = (float)(uStack_200 >> 0x20);
      local_228 = -(uint)(8388608.0 < (float)local_d8);
      uStack_224 = -(uint)(8388608.0 < local_d8._4_4_);
      uStack_220 = -(uint)(8388608.0 < (float)uStack_d0);
      uStack_21c = -(uint)(8388608.0 < uStack_d0._4_4_);
      local_b8 = (int)(float)local_d8;
      iStack_b4 = (int)local_d8._4_4_;
      iStack_b0 = (int)(float)uStack_d0;
      iStack_ac = (int)uStack_d0._4_4_;
      local_238 = (float)local_b8;
      fStack_234 = (float)iStack_b4;
      fStack_230 = (float)iStack_b0;
      fStack_22c = (float)iStack_ac;
      local_68 = CONCAT44(fStack_234,local_238);
      uStack_60 = CONCAT44(fStack_22c,fStack_230);
      local_248 = local_68 | local_218;
      uStack_240 = uStack_60 | uStack_210;
      local_e8._0_4_ = (float)local_1d8;
      local_e8._4_4_ = (float)(local_1d8 >> 0x20);
      uStack_e0._0_4_ = (float)uStack_1d0;
      uStack_e0._4_4_ = (float)(uStack_1d0 >> 0x20);
      local_f8._0_4_ = (float)local_248;
      local_f8._4_4_ = (float)(local_248 >> 0x20);
      uStack_f0._0_4_ = (float)uStack_240;
      uStack_f0._4_4_ = (float)(uStack_240 >> 0x20);
      local_198 = -(uint)((float)local_e8 < (float)local_f8);
      iStack_194 = -(uint)(local_e8._4_4_ < local_f8._4_4_);
      iStack_190 = -(uint)((float)uStack_e0 < (float)uStack_f0);
      iStack_18c = -(uint)(uStack_e0._4_4_ < uStack_f0._4_4_);
      local_144 = 0x3f800000;
      local_4 = 0x3f800000;
      local_18 = 0x3f800000;
      local_1a8 = 0x3f8000003f800000;
      uStack_1a0 = 0x3f8000003f800000;
      local_258 = CONCAT44(iStack_194,local_198) & 0x3f8000003f800000;
      uStack_250 = CONCAT44(iStack_18c,iStack_190) & 0x3f8000003f800000;
      local_168._0_4_ = (float)local_258;
      local_168._4_4_ = (float)(local_258 >> 0x20);
      uStack_160._0_4_ = (float)uStack_250;
      uStack_160._4_4_ = (float)(uStack_250 >> 0x20);
      local_268 = (float)local_f8 - (float)local_168;
      fStack_264 = local_f8._4_4_ - local_168._4_4_;
      fStack_260 = (float)uStack_f0 - (float)uStack_160;
      fStack_25c = uStack_f0._4_4_ - uStack_160._4_4_;
      local_1c8 = CONCAT44(uStack_224,local_228);
      uStack_1c0 = CONCAT44(uStack_21c,uStack_220);
      local_88 = local_1d8 & local_1c8;
      uStack_80 = uStack_1d0 & uStack_1c0;
      local_128 = CONCAT44(uStack_224,local_228);
      uStack_120 = CONCAT44(uStack_21c,uStack_220);
      local_138 = CONCAT44(fStack_264,local_268);
      uStack_130 = CONCAT44(fStack_25c,fStack_260);
      local_98 = (local_228 ^ 0xffffffff) & (uint)local_268;
      uStack_94 = (uStack_224 ^ 0xffffffff) & (uint)fStack_264;
      uStack_90 = (uStack_220 ^ 0xffffffff) & (uint)fStack_260;
      uStack_8c = (uStack_21c ^ 0xffffffff) & (uint)fStack_25c;
      local_3e8 = local_88 | CONCAT44(uStack_94,local_98);
      uStack_3e0 = uStack_80 | CONCAT44(uStack_8c,uStack_90);
      local_308 = local_388;
      local_318._0_4_ = (float)local_3e8;
      local_318._4_4_ = (float)(local_3e8 >> 0x20);
      uStack_310._0_4_ = (float)uStack_3e0;
      uStack_310._4_4_ = (float)(uStack_3e0 >> 0x20);
      *local_388 = (float)local_318;
      local_388[1] = local_318._4_4_;
      local_388[2] = (float)uStack_310;
      local_388[3] = uStack_310._4_4_;
      local_388 = local_388 + 4;
      local_318 = local_3e8;
      uStack_310 = uStack_3e0;
      local_1b8 = local_1d8;
      uStack_1b0 = uStack_1d0;
      local_188 = local_1d8;
      uStack_180 = uStack_1d0;
      local_178 = local_1e8;
      uStack_170 = uStack_1e0;
      local_168 = local_258;
      uStack_160 = uStack_250;
      local_158 = local_248;
      uStack_150 = uStack_240;
      local_118 = local_1d8;
      uStack_110 = uStack_1d0;
      local_108 = local_1e8;
      uStack_100 = uStack_1e0;
      local_f8 = local_248;
      uStack_f0 = uStack_240;
      local_e8 = local_1d8;
      uStack_e0 = uStack_1d0;
      local_d8 = local_208;
      uStack_d0 = uStack_200;
      local_c8 = local_1f8;
      uStack_c0 = uStack_1f0;
      local_a8 = local_208;
      uStack_a0 = uStack_200;
      local_78 = local_218;
      uStack_70 = uStack_210;
      uStack_54 = local_58;
      uStack_50 = local_58;
      uStack_4c = local_58;
      uStack_34 = local_38;
      uStack_30 = local_38;
      uStack_2c = local_38;
      uStack_14 = local_18;
      uStack_10 = local_18;
      uStack_c = local_18;
    }
    for (; local_3d4 < local_37c; local_3d4 = local_3d4 + 1) {
      local_270 = local_361;
      local_278 = local_388;
      fVar1 = floorf(*local_388);
      *local_388 = fVar1;
      local_388 = local_388 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}